

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.hpp
# Opt level: O3

void qclab::dense::kron<qclab::dense::SquareMatrix<float>>
               (SquareMatrix<float> *A,SquareMatrix<float> *B,SquareMatrix<float> *kronAB)

{
  long lVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  long lVar13;
  long local_68;
  long local_60;
  
  lVar1 = A->size_;
  lVar2 = B->size_;
  lVar3 = kronAB->size_;
  if (lVar3 == lVar2 * lVar1) {
    if (0 < lVar1) {
      local_60 = 0;
      local_68 = 0;
      do {
        if (0 < lVar2) {
          lVar8 = 0;
          lVar13 = 0;
          lVar12 = local_60;
          do {
            pfVar4 = (A->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                     _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar10 = (float *)((long)(kronAB->data_)._M_t.
                                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                                      _M_t.
                                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                      .super__Head_base<0UL,_float_*,_false>._M_head_impl + lVar12);
            pfVar5 = (B->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                     _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            lVar7 = 0;
            do {
              lVar6 = lVar2;
              pfVar9 = (float *)((long)pfVar5 + lVar8);
              pfVar11 = pfVar10;
              do {
                *pfVar11 = pfVar4[local_68 + lVar7 * lVar1] * *pfVar9;
                pfVar11 = pfVar11 + lVar3;
                pfVar9 = pfVar9 + lVar2;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              lVar7 = lVar7 + 1;
              pfVar10 = pfVar10 + lVar3 * lVar2;
            } while (lVar7 != lVar1);
            lVar13 = lVar13 + 1;
            lVar12 = lVar12 + 4;
            lVar8 = lVar8 + 4;
          } while (lVar13 != lVar2);
        }
        local_68 = local_68 + 1;
        local_60 = local_60 + lVar2 * 4;
      } while (local_68 != lVar1);
    }
    return;
  }
  __assert_fail("kronAB.rows() == rowsA * rowsB",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/kron.hpp"
                ,0x12,
                "void qclab::dense::kron(const T &, const T &, T &) [T = qclab::dense::SquareMatrix<float>]"
               );
}

Assistant:

void kron( const T& A , const T& B , T& kronAB ) {
      const int64_t rowsA = A.rows() ;
      const int64_t colsA = A.cols() ;
      const int64_t rowsB = B.rows() ;
      const int64_t colsB = B.cols() ;
      assert( kronAB.rows() == rowsA * rowsB ) ;
      assert( kronAB.cols() == colsA * colsB ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < rowsA; i++ ) {        // i loops over rows of A
        for ( int64_t k = 0; k < rowsB; k++ ) {      // k loops over rows of B
          for ( int64_t j = 0; j < colsA; j++ ) {    // j loops over cols of A
            for ( int64_t l = 0; l < colsB; l++ ) {  // l loops over cols of B
              kronAB( i*rowsB + k , j*colsB + l ) = A(i,j) * B(k,l) ;
            }
          }
        }
      }
    }